

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O0

int ldesdecode(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  int local_244;
  uint8_t **ppuStack_240;
  int padding;
  uint8_t *buffer;
  uint8_t tmp [256];
  uint8_t *text;
  size_t textsz;
  uint32_t local_118;
  int i;
  uint32_t SK [32];
  uint32_t ESK [32];
  lua_State *L_local;
  
  des_key(L,SK + 0x1e);
  for (textsz._4_4_ = 0; textsz._4_4_ < 0x20; textsz._4_4_ = textsz._4_4_ + 2) {
    (&local_118)[textsz._4_4_] = SK[(long)(0x1e - textsz._4_4_) + 0x1e];
    (&local_118)[textsz._4_4_ + 1] = SK[(long)(0x1f - textsz._4_4_) + 0x1e];
  }
  text = (uint8_t *)0x0;
  pcVar2 = luaL_checklstring(L,2,(size_t *)&text);
  if ((((ulong)text & 7) == 0) && (text != (uint8_t *)0x0)) {
    ppuStack_240 = &buffer;
    if ((uint8_t *)0x100 < text) {
      ppuStack_240 = (uint8_t **)lua_newuserdata(L,(size_t)text);
    }
    for (textsz._4_4_ = 0; (uint8_t *)(long)textsz._4_4_ < text; textsz._4_4_ = textsz._4_4_ + 8) {
      des_crypt(&local_118,(uint8_t *)(pcVar2 + textsz._4_4_),
                (uint8_t *)((long)ppuStack_240 + (long)textsz._4_4_));
    }
    local_244 = 1;
    textsz._4_4_ = (int)text;
    while (textsz._4_4_ = textsz._4_4_ + -1, text + -8 <= (uint8_t *)(long)textsz._4_4_) {
      if (*(char *)((long)ppuStack_240 + (long)textsz._4_4_) != '\0') {
        if (*(char *)((long)ppuStack_240 + (long)textsz._4_4_) != -0x80) {
          iVar1 = luaL_error(L,"Invalid des crypt text");
          return iVar1;
        }
        break;
      }
      local_244 = local_244 + 1;
    }
    if (local_244 < 9) {
      lua_pushlstring(L,(char *)ppuStack_240,(long)text - (long)local_244);
      L_local._4_4_ = 1;
    }
    else {
      L_local._4_4_ = luaL_error(L,"Invalid des crypt text");
    }
  }
  else {
    L_local._4_4_ = luaL_error(L,"Invalid des crypt text length %d",(ulong)text & 0xffffffff);
  }
  return L_local._4_4_;
}

Assistant:

static int
ldesdecode(lua_State *L) {
	uint32_t ESK[32];
	des_key(L, ESK);
	uint32_t SK[32];
	int i;
	for( i = 0; i < 32; i += 2 ) {
		SK[i] = ESK[30 - i];
		SK[i + 1] = ESK[31 - i];
	}
	size_t textsz = 0;
	const uint8_t *text = (const uint8_t *)luaL_checklstring(L, 2, &textsz);
	if ((textsz & 7) || textsz == 0) {
		return luaL_error(L, "Invalid des crypt text length %d", (int)textsz);
	}
	uint8_t tmp[SMALL_CHUNK];
	uint8_t *buffer = tmp;
	if (textsz > SMALL_CHUNK) {
		buffer = lua_newuserdata(L, textsz);
	}
	for (i=0;i<textsz;i+=8) {
		des_crypt(SK, text+i, buffer+i);
	}
	int padding = 1;
	for (i=textsz-1;i>=textsz-8;i--) {
		if (buffer[i] == 0) {
			padding++;
		} else if (buffer[i] == 0x80) {
			break;
		} else {
			return luaL_error(L, "Invalid des crypt text");
		}
	}
	if (padding > 8) {
		return luaL_error(L, "Invalid des crypt text");
	}
	lua_pushlstring(L, (const char *)buffer, textsz - padding);
	return 1;
}